

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

void Fx_ManFindCommonPairs
               (Vec_Wec_t *vCubes,Vec_Int_t *vPart0,Vec_Int_t *vPart1,Vec_Int_t *vPairs,
               Vec_Int_t *vCompls,Vec_Int_t *vDiv,Vec_Int_t *vCubeFree,int *fWarning)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *fWarning_00;
  uint Entry;
  int *piVar11;
  int *piVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  long local_70;
  
  piVar4 = vPart0->pArray;
  piVar17 = vPart1->pArray;
  iVar3 = vPart0->nSize;
  iVar6 = vPart1->nSize;
  vPairs->nSize = 0;
  vCompls->nSize = 0;
  piVar1 = piVar17 + iVar6;
  fWarning_00 = vPairs;
  piVar5 = piVar4;
  piVar14 = piVar4;
  do {
    while( true ) {
      piVar12 = piVar17;
      piVar11 = piVar5;
      piVar14 = piVar14 + 1;
      if ((piVar4 + iVar3 <= piVar11) || (piVar1 <= piVar12)) {
        return;
      }
      iVar6 = Fx_ManGetCubeVar(vCubes,*piVar11);
      iVar7 = Fx_ManGetCubeVar(vCubes,*piVar12);
      piVar17 = piVar12;
      if (iVar6 == iVar7) break;
      if (iVar6 < iVar7) {
        piVar5 = piVar11 + 1;
      }
      else {
        piVar5 = piVar11;
        piVar14 = piVar11;
        piVar17 = piVar12 + 1;
      }
    }
    local_70 = 1;
    while ((piVar14 < piVar4 + iVar3 && (iVar7 = Fx_ManGetCubeVar(vCubes,*piVar14), iVar6 == iVar7))
          ) {
      local_70 = local_70 + 1;
      piVar14 = piVar14 + 1;
    }
    lVar16 = 1;
    while ((piVar17 = piVar17 + 1, piVar17 < piVar1 &&
           (iVar7 = Fx_ManGetCubeVar(vCubes,*piVar17), iVar6 == iVar7))) {
      lVar16 = lVar16 + 1;
    }
    for (lVar13 = 0; piVar5 = piVar14, local_70 != lVar13; lVar13 = lVar13 + 1) {
      for (lVar15 = 0; lVar16 != lVar15; lVar15 = lVar15 + 1) {
        if (piVar11[lVar13] != piVar12[lVar15]) {
          pVVar9 = Vec_WecEntry(vCubes,piVar11[lVar13]);
          pVVar10 = Vec_WecEntry(vCubes,piVar12[lVar15]);
          Fx_ManDivFindCubeFree(pVVar9,pVVar10,vCubeFree,&fWarning_00->nCap);
          uVar8 = vCubeFree->nSize;
          Entry = 0;
          if (uVar8 == 4) {
            iVar6 = Fx_ManDivNormalize(vCubeFree);
            Entry = (uint)(iVar6 == 1);
            uVar8 = vCubeFree->nSize;
          }
          if (vDiv->nSize == uVar8) {
            pVVar9 = (Vec_Int_t *)(ulong)uVar8;
            if ((int)uVar8 < 1) {
              pVVar9 = (Vec_Int_t *)0x0;
            }
            pVVar10 = (Vec_Int_t *)0x0;
            do {
              if (pVVar9 == pVVar10) {
                Vec_IntPush(vPairs,piVar11[lVar13]);
                Vec_IntPush(vPairs,piVar12[lVar15]);
                Vec_IntPush(vCompls,Entry);
                fWarning_00 = pVVar10;
                break;
              }
              piVar5 = vDiv->pArray + (long)pVVar10;
              fWarning_00 = (Vec_Int_t *)((long)&pVVar10->nCap + 1);
              piVar2 = vCubeFree->pArray + (long)pVVar10;
              pVVar10 = fWarning_00;
            } while (*piVar5 == *piVar2);
          }
        }
      }
    }
  } while( true );
}

Assistant:

void Fx_ManFindCommonPairs( Vec_Wec_t * vCubes, Vec_Int_t * vPart0, Vec_Int_t * vPart1, Vec_Int_t * vPairs, Vec_Int_t * vCompls, Vec_Int_t * vDiv, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = vPart0->pArray;
    int * pBeg2 = vPart1->pArray;
    int * pEnd1 = vPart0->pArray + vPart0->nSize;
    int * pEnd2 = vPart1->pArray + vPart1->nSize;
    int i, k, i_, k_, fCompl, CubeId1, CubeId2;
    Vec_IntClear( vPairs );
    Vec_IntClear( vCompls );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        CubeId1 = Fx_ManGetCubeVar(vCubes, *pBeg1);
        CubeId2 = Fx_ManGetCubeVar(vCubes, *pBeg2);
        if ( CubeId1 == CubeId2 )
        {
            for ( i = 1; pBeg1+i < pEnd1; i++ )
                if ( CubeId1 != Fx_ManGetCubeVar(vCubes, pBeg1[i]) )
                    break;
            for ( k = 1; pBeg2+k < pEnd2; k++ )
                if ( CubeId1 != Fx_ManGetCubeVar(vCubes, pBeg2[k]) )
                    break;
            for ( i_ = 0; i_ < i; i_++ )
            for ( k_ = 0; k_ < k; k_++ )
            {
                if ( pBeg1[i_] == pBeg2[k_] )
                    continue;
                Fx_ManDivFindCubeFree( Vec_WecEntry(vCubes, pBeg1[i_]), Vec_WecEntry(vCubes, pBeg2[k_]), vCubeFree, fWarning );
                fCompl = (Vec_IntSize(vCubeFree) == 4 && Fx_ManDivNormalize(vCubeFree) == 1);
                if ( !Vec_IntEqual( vDiv, vCubeFree ) )
                    continue;
                Vec_IntPush( vPairs, pBeg1[i_] );
                Vec_IntPush( vPairs, pBeg2[k_] );
                Vec_IntPush( vCompls, fCompl );
            }
            pBeg1 += i;
            pBeg2 += k;
        }
        else if ( CubeId1 < CubeId2 )
            pBeg1++;
        else 
            pBeg2++;
    }
}